

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void moveToParent(BtCursor *pCur)

{
  char cVar1;
  long in_RDI;
  MemPage *pLeaf;
  
  *(undefined2 *)(in_RDI + 0x46) = 0;
  *(byte *)(in_RDI + 1) = *(byte *)(in_RDI + 1) & 0xf9;
  *(undefined2 *)(in_RDI + 0x56) =
       *(undefined2 *)(in_RDI + 0x58 + (long)(*(char *)(in_RDI + 0x54) + -1) * 2);
  cVar1 = *(char *)(in_RDI + 0x54) + -1;
  *(char *)(in_RDI + 0x54) = cVar1;
  *(undefined8 *)(in_RDI + 0x88) = *(undefined8 *)(in_RDI + 0x90 + (long)cVar1 * 8);
  releasePageNotNull((MemPage *)0x18ee1a);
  return;
}

Assistant:

static void moveToParent(BtCursor *pCur){
  MemPage *pLeaf;
  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->iPage>0 );
  assert( pCur->pPage );
  assertParentIndex(
    pCur->apPage[pCur->iPage-1],
    pCur->aiIdx[pCur->iPage-1],
    pCur->pPage->pgno
  );
  testcase( pCur->aiIdx[pCur->iPage-1] > pCur->apPage[pCur->iPage-1]->nCell );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  pCur->ix = pCur->aiIdx[pCur->iPage-1];
  pLeaf = pCur->pPage;
  pCur->pPage = pCur->apPage[--pCur->iPage];
  releasePageNotNull(pLeaf);
}